

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

result_type __thiscall
math::wide_integer::uniform_int_distribution<48u,unsigned_short,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<48u,unsigned_short,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  unsigned_fast_type uVar1;
  bool bVar2;
  result_type rVar3;
  local_wide_integer_type lVar4;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar5;
  array<unsigned_short,_3UL> *paVar6;
  iterator puVar7;
  long lVar8;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  undefined5 extraout_var_01;
  undefined5 extraout_var_02;
  undefined5 extraout_var_03;
  undefined5 extraout_var_04;
  undefined5 extraout_var_05;
  undefined5 extraout_var_06;
  bool local_91;
  undefined4 local_7e;
  undefined2 local_7a;
  undefined4 local_78;
  undefined2 local_74;
  undefined4 local_72;
  undefined2 local_6e;
  undefined4 local_6c;
  undefined2 local_68;
  undefined1 auStack_66 [2];
  result_type range;
  undefined4 local_60;
  undefined2 local_5c;
  undefined4 local_5a;
  undefined2 local_56;
  undefined4 local_54;
  undefined2 local_50;
  byte local_4d;
  undefined4 local_4c;
  uint8_t next_byte;
  ulong uStack_48;
  uint right_shift_amount;
  unsigned_fast_type j;
  iterator it;
  generator_result_type value;
  uint32_t digits_gtor_ratio;
  uint32_t digits_limb_ratio;
  uint32_t digits_generator_result_type;
  param_type *input_params_local;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator_local;
  uniform_int_distribution<24U,_unsigned_char,_void,_false> *this_local;
  result_type result;
  
  _digits_limb_ratio = input_params;
  input_params_local = (param_type *)input_generator;
  input_generator_local = (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)this;
  uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::digits),void>::type__
            ((void *)((long)&this_local + 2),'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  digits_gtor_ratio = 0x20;
  value = 2;
  it._4_4_ = 4;
  it._0_4_ = 0;
  paVar6 = (array<unsigned_short,_3UL> *)
           uintwide_t<48U,_unsigned_short,_void,_false>::representation
                     ((uintwide_t<48U,_unsigned_short,_void,_false> *)((long)&this_local + 2));
  j = (unsigned_fast_type)detail::array_detail::array<unsigned_short,_3UL>::begin(paVar6);
  uStack_48 = 0;
  while( true ) {
    uVar1 = j;
    paVar6 = (array<unsigned_short,_3UL> *)
             uintwide_t<48U,_unsigned_short,_void,_false>::representation
                       ((uintwide_t<48U,_unsigned_short,_void,_false> *)((long)&this_local + 2));
    puVar7 = detail::array_detail::array<unsigned_short,_3UL>::end(paVar6);
    if ((iterator)uVar1 == puVar7) break;
    if ((uStack_48 & 3) == 0) {
      it._0_4_ = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                           ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                            input_params_local);
    }
    lVar8 = (uStack_48 & 3) << 3;
    local_4c = (undefined4)lVar8;
    local_4d = (byte)((result_type)it >> (sbyte)lVar8);
    *(ushort *)j = *(ushort *)j | (ushort)local_4d << (sbyte)((uStack_48 & 1) << 3);
    uStack_48 = uStack_48 + 1;
    if ((uStack_48 & 1) == 0) {
      j = j + 2;
    }
  }
  rVar3 = uniform_int_distribution<48U,_unsigned_short,_void,_false>::param_type::get_a
                    ((param_type *)_digits_limb_ratio);
  local_54 = (undefined4)CONCAT53(extraout_var,rVar3.values.super_array<unsigned_char,_3UL>.elems);
  local_50 = (undefined2)((uint5)extraout_var >> 8);
  lVar4 = numeric_limits_uintwide_t_base<48U,_unsigned_short,_void,_false>::min();
  local_5a = (undefined4)
             CONCAT53(extraout_var_00,lVar4.values.super_array<unsigned_char,_3UL>.elems);
  local_56 = (undefined2)((uint5)extraout_var_00 >> 8);
  bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::operator!=
                    ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_54,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_5a);
  local_91 = true;
  if (!bVar2) {
    rVar3 = uniform_int_distribution<48U,_unsigned_short,_void,_false>::param_type::get_b
                      ((param_type *)_digits_limb_ratio);
    local_60 = (undefined4)
               CONCAT53(extraout_var_01,rVar3.values.super_array<unsigned_char,_3UL>.elems);
    local_5c = (undefined2)((uint5)extraout_var_01 >> 8);
    lVar4 = numeric_limits_uintwide_t_base<48U,_unsigned_short,_void,_false>::max();
    _auStack_66 = (undefined4)
                  CONCAT53(extraout_var_02,lVar4.values.super_array<unsigned_char,_3UL>.elems);
    register0x00000000 = (undefined2)((uint5)extraout_var_02 >> 8);
    local_91 = uintwide_t<48U,_unsigned_short,_void,_false>::operator!=
                         ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_60,
                          (uintwide_t<24U,_unsigned_char,_void,_false> *)auStack_66);
  }
  if (local_91 != false) {
    rVar3 = uniform_int_distribution<48U,_unsigned_short,_void,_false>::param_type::get_b
                      ((param_type *)_digits_limb_ratio);
    local_72 = (undefined4)
               CONCAT53(extraout_var_03,rVar3.values.super_array<unsigned_char,_3UL>.elems);
    local_6e = (undefined2)((uint5)extraout_var_03 >> 8);
    rVar3 = uniform_int_distribution<48U,_unsigned_short,_void,_false>::param_type::get_a
                      ((param_type *)_digits_limb_ratio);
    local_78 = (undefined4)
               CONCAT53(extraout_var_04,rVar3.values.super_array<unsigned_char,_3UL>.elems);
    local_74 = (undefined2)((uint5)extraout_var_04 >> 8);
    uVar5 = wide_integer::operator-
                      ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_72,
                       (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_78);
    local_6c = (undefined4)
               CONCAT53(extraout_var_05,uVar5.values.super_array<unsigned_char,_3UL>.elems);
    local_68 = (undefined2)((uint5)extraout_var_05 >> 8);
    uintwide_t<48U,_unsigned_short,_void,_false>::operator++
              ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_6c);
    uintwide_t<48U,_unsigned_short,_void,_false>::operator%=
              ((uintwide_t<48U,_unsigned_short,_void,_false> *)((long)&this_local + 2),
               (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_6c);
    rVar3 = uniform_int_distribution<48U,_unsigned_short,_void,_false>::param_type::get_a
                      ((param_type *)_digits_limb_ratio);
    local_7e = (undefined4)
               CONCAT53(extraout_var_06,rVar3.values.super_array<unsigned_char,_3UL>.elems);
    local_7a = (undefined2)((uint5)extraout_var_06 >> 8);
    uintwide_t<48U,_unsigned_short,_void,_false>::operator+=
              ((uintwide_t<48U,_unsigned_short,_void,_false> *)((long)&this_local + 2),
               (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_7e);
  }
  return (representation_type)(array<unsigned_char,_3UL>)SUB43(this_local._2_4_,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }